

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagegenerator.cpp
# Opt level: O2

void stackjit::anon_unknown_3::addData<unsigned_long>(BinaryData *data,unsigned_long value)

{
  char *valuePtr;
  size_t i;
  long lVar1;
  unsigned_long local_18;
  
  local_18 = value;
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    std::vector<char,_std::allocator<char>_>::push_back
              (data,(value_type *)((long)&local_18 + lVar1));
  }
  return;
}

Assistant:

void addData(BinaryData& data, T value) {
			auto valuePtr = reinterpret_cast<char*>(&value);

			for (std::size_t i = 0; i < sizeof(T); i++) {
				data.push_back(valuePtr[i]);
			}
		}